

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::WriteIndent(TextGenerator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *other;
  uint uVar4;
  char *local_70;
  void *void_buffer;
  LogFinisher local_31;
  
  if (this->indent_level_ != 0) {
    if (this->failed_ == true) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&stack0xffffffffffffff90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/text_format.cc"
                 ,0x520);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)&stack0xffffffffffffff90,"CHECK failed: !failed_: ");
      internal::LogFinisher::operator=(&local_31,other);
      internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff90);
    }
    iVar2 = (*(this->super_BaseTextGenerator)._vptr_BaseTextGenerator[4])(this);
    while( true ) {
      uVar4 = this->buffer_size_;
      if (iVar2 <= (int)uVar4) break;
      if (0 < (int)uVar4) {
        memset(this->buffer_,0x20,(ulong)uVar4);
        uVar4 = this->buffer_size_;
      }
      iVar3 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&stack0xffffffffffffff90,&this->buffer_size_);
      bVar1 = (bool)((byte)iVar3 ^ 1);
      this->failed_ = bVar1;
      if (bVar1 != false) {
        return;
      }
      iVar2 = iVar2 - uVar4;
      this->buffer_ = local_70;
    }
    memset(this->buffer_,0x20,(long)iVar2);
    this->buffer_ = this->buffer_ + iVar2;
    this->buffer_size_ = this->buffer_size_ - iVar2;
  }
  return;
}

Assistant:

void WriteIndent() {
    if (indent_level_ == 0) {
      return;
    }
    GOOGLE_DCHECK(!failed_);
    int size = GetCurrentIndentationSize();

    while (size > buffer_size_) {
      // Data exceeds space in the buffer. Write what we can and request a new
      // buffer.
      if (buffer_size_ > 0) {
        memset(buffer_, ' ', buffer_size_);
      }
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memset(buffer_, ' ', size);
    buffer_ += size;
    buffer_size_ -= size;
  }